

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O3

void __thiscall FGLRenderer::RenderView(FGLRenderer *this,player_t *player)

{
  float ratio;
  bool bVar1;
  int iVar2;
  DFrameBuffer *pDVar3;
  uint uVar4;
  AActor *pAVar5;
  DThinker *pDVar6;
  AActor *pAVar7;
  DWORD *this_00;
  double dVar8;
  TThinkerIterator<ADynamicLight> it;
  FThinkerIterator local_48;
  
  pDVar3 = screen;
  this_00 = (DWORD *)this;
  checkBenchActive();
  pAVar5 = (AActor *)pDVar3[0x22].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
  pAVar7 = (player->camera).field_0.p;
  if (pAVar7 == (AActor *)0x0) {
LAB_004761cb:
    pAVar7 = (AActor *)0x0;
  }
  else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (player->camera).field_0.p = (AActor *)0x0;
    goto LAB_004761cb;
  }
  if (pAVar7 != pAVar5) {
    R_ResetViewInterpolation();
    pAVar5 = (player->camera).field_0.p;
    if (pAVar5 == (AActor *)0x0) {
LAB_004761f4:
      pAVar5 = (AActor *)0x0;
    }
    else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (player->camera).field_0.p = (AActor *)0x0;
      goto LAB_004761f4;
    }
    pDVar3[0x22].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
         (_func_int **)pAVar5;
  }
  gl_RenderState.mVertexBuffer = &this->mVBO->super_FVertexBuffer;
  GLRenderer->mVBO->mCurIndex = GLRenderer->mVBO->mIndex;
  ResetProfilingData();
  dVar8 = 1.0;
  if ((cl_capfps.Value == false) && (r_NoInterpolate == false)) {
    this_00 = &r_FrameTime;
    dVar8 = I_GetTimeFrac(&r_FrameTime);
  }
  r_TicFracF = dVar8;
  uVar4 = I_MSTime();
  gl_frameMS = (long)uVar4;
  P_FindParticleSubsectors();
  if (gl.legacyMode == false) {
    this_00 = (DWORD *)GLRenderer->mLights;
    FLightBuffer::Clear((FLightBuffer *)this_00);
  }
  bVar1 = NoInterpolateView;
  NoInterpolateView = false;
  FCanvasTextureInfo::UpdateAll();
  iVar2 = WidescreenRatio;
  ratio = RenderView::ratios[WidescreenRatio];
  NoInterpolateView = bVar1;
  SetFixedColormap((FGLRenderer *)this_00,player);
  FThinkerIterator::FThinkerIterator(&local_48,ADynamicLight::RegistrationInfo.MyClass,0x40);
  pDVar6 = FThinkerIterator::Next(&local_48);
  GLRenderer->mLightCount = (uint)(pDVar6 != (DThinker *)0x0);
  pAVar5 = (player->camera).field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00476324;
    (player->camera).field_0.p = (AActor *)0x0;
  }
  pAVar5 = (AActor *)0x0;
LAB_00476324:
  RenderViewpoint(this,pAVar5,(GL_IRECT *)0x0,(float)FieldOfView.Degrees,ratio,
                  *(float *)(&DAT_0074de30 + (ulong)(iVar2 == 4) * 4),true,true);
  return;
}

Assistant:

void FGLRenderer::RenderView (player_t* player)
{
	OpenGLFrameBuffer* GLTarget = static_cast<OpenGLFrameBuffer*>(screen);
	AActor *&LastCamera = GLTarget->LastCamera;

	checkBenchActive();
	if (player->camera != LastCamera)
	{
		// If the camera changed don't interpolate
		// Otherwise there will be some not so nice effects.
		R_ResetViewInterpolation();
		LastCamera=player->camera;
	}

	gl_RenderState.SetVertexBuffer(mVBO);
	GLRenderer->mVBO->Reset();

	// reset statistics counters
	ResetProfilingData();

	// Get this before everything else
	if (cl_capfps || r_NoInterpolate) r_TicFracF = 1.;
	else r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	gl_frameMS = I_MSTime();

	P_FindParticleSubsectors ();

	if (!gl.legacyMode) GLRenderer->mLights->Clear();

	// NoInterpolateView should have no bearing on camera textures, but needs to be preserved for the main view below.
	bool saved_niv = NoInterpolateView;
	NoInterpolateView = false;
	// prepare all camera textures that have been used in the last frame
	FCanvasTextureInfo::UpdateAll();
	NoInterpolateView = saved_niv;


	// I stopped using BaseRatioSizes here because the information there wasn't well presented.
	//							4:3				16:9		16:10		17:10		5:4
	static float ratios[]={1.333333f, 1.777777f, 1.6f, 1.7f, 1.25f, 1.7f, 2.333333f};

	// now render the main view
	float fovratio;
	float ratio = ratios[WidescreenRatio];
	if (! Is54Aspect(WidescreenRatio))
	{
		fovratio = 1.333333f;
	}
	else
	{
		fovratio = ratio;
	}

	SetFixedColormap (player);

	// Check if there's some lights. If not some code can be skipped.
	TThinkerIterator<ADynamicLight> it(STAT_DLIGHT);
	GLRenderer->mLightCount = ((it.Next()) != NULL);

	sector_t * viewsector = RenderViewpoint(player->camera, NULL, FieldOfView.Degrees, ratio, fovratio, true, true);

	All.Unclock();
}